

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O2

void __thiscall
rpn::CommandCallExpression::CallCommand
          (CommandCallExpression *this,results_iterator argsBegin,results_iterator argsEnd,
          CommandContext *commandContext)

{
  anon_class_16_2_7294f495 __f;
  string result;
  string delimiter;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,", ",(allocator<char> *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"[call(",(allocator<char> *)&local_38);
  std::operator+(&local_38,argsBegin._M_current,&local_58);
  std::__cxx11::string::append((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  __f.delimiter = &local_58;
  __f.result = &sStack_78;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,rpn::CommandCallExpression::CallCommand(__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,rpn::CommandContext&)const::_lambda(auto:1_const&)_1_>
            (argsBegin._M_current + 1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )argsEnd._M_current,__f);
  std::__cxx11::string::resize((ulong)&sStack_78);
  std::__cxx11::string::append((char *)&sStack_78);
  std::__cxx11::string::operator=((string *)commandContext,(string *)&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void CallCommand(
        results_iterator argsBegin,
        results_iterator argsEnd,
        CommandContext& commandContext) const
    {
        const auto& name = *argsBegin;
        std::advance(argsBegin, 1);

        const std::string delimiter{", "};
        std::string result{"[call("};
        result += name + delimiter;

        std::for_each(
            argsBegin, argsEnd, [&result, &delimiter](const auto& arg) {
                result += arg + delimiter;
            });
        result.resize(result.size() - delimiter.size());
        result += ")]";

        commandContext.result = std::move(result);
    }